

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

vector<NPC_*,_std::allocator<NPC_*>_> * __thiscall
Map::NPCsInRange(vector<NPC_*,_std::allocator<NPC_*>_> *__return_storage_ptr__,Map *this,uchar x,
                uchar y,uchar range)

{
  pointer ppNVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined3 in_register_00000081;
  pointer ppNVar5;
  NPC *npc;
  NPC *local_38;
  
  (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppNVar1 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar5 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar5 != ppNVar1; ppNVar5 = ppNVar5 + 1) {
    local_38 = *ppNVar5;
    iVar4 = (uint)local_38->x - (int)CONCAT71(in_register_00000011,x);
    iVar2 = -iVar4;
    if (0 < iVar4) {
      iVar2 = iVar4;
    }
    iVar3 = (uint)local_38->y - (int)CONCAT71(in_register_00000009,y);
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    if ((uint)(iVar4 + iVar2) <= CONCAT31(in_register_00000081,range)) {
      std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back(__return_storage_ptr__,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<NPC *> Map::NPCsInRange(unsigned char x, unsigned char y, unsigned char range)
{
	std::vector<NPC *> npcs;

	UTIL_FOREACH(this->npcs, npc)
	{
		if (util::path_length(npc->x, npc->y, x, y) <= range)
			npcs.push_back(npc);
	}

	return npcs;
}